

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
ranges::detail::
print_rng_<std::ostream,ranges::subrange<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,(ranges::subrange_kind)1>const>
          (basic_ostream<char,_std::char_traits<char>_> *sout,
          subrange<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_(ranges::subrange_kind)1>
          *rng)

{
  int *piVar1;
  int *piVar2;
  char local_23;
  char local_22;
  char local_21;
  
  std::__ostream_insert<char,std::char_traits<char>>(sout,&local_22,1);
  piVar1 = (rng->data_).
           super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           .
           super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           .
           super__Head_base<1UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
           ._M_head_impl._M_current;
  piVar2 = (rng->data_).
           super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
           .
           super__Head_base<0UL,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
           ._M_head_impl._M_current;
  if (piVar2 != piVar1) {
    std::ostream::operator<<((ostream *)sout,*piVar2);
    piVar2 = piVar2 + 1;
    if (piVar2 != piVar1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(sout,&local_23,1);
        std::ostream::operator<<((ostream *)sout,*piVar2);
        piVar2 = piVar2 + 1;
      } while (piVar2 != piVar1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(sout,&local_21,1);
  return sout;
}

Assistant:

Stream & print_rng_(Stream & sout, Rng & rng)
        {
            sout << '[';
            auto it = ranges::begin(rng);
            auto const e = ranges::end(rng);
            if(it != e)
            {
                for(;;)
                {
                    sout << *it;
                    if(++it == e)
                        break;
                    sout << ',';
                }
            }
            sout << ']';
            return sout;
        }